

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * re2::Regexp::Capture(Regexp *sub,ParseFlags flags,int cap)

{
  Regexp *this;
  Regexp **ppRVar1;
  Regexp *re;
  int cap_local;
  ParseFlags flags_local;
  Regexp *sub_local;
  
  this = (Regexp *)operator_new(0x28);
  Regexp(this,kRegexpCapture,flags);
  AllocSub(this,1);
  ppRVar1 = Regexp::sub(this);
  *ppRVar1 = sub;
  (this->field_7).field_0.max_ = cap;
  return this;
}

Assistant:

Regexp* Regexp::Capture(Regexp* sub, ParseFlags flags, int cap) {
  Regexp* re = new Regexp(kRegexpCapture, flags);
  re->AllocSub(1);
  re->sub()[0] = sub;
  re->cap_ = cap;
  return re;
}